

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsequentialanimationgroup.cpp
# Opt level: O3

AnimationIndex __thiscall
QSequentialAnimationGroupPrivate::indexForCurrentTime(QSequentialAnimationGroupPrivate *this)

{
  uint uVar1;
  ulong uVar2;
  int iVar3;
  parameter_type pVar4;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  
  uVar6 = 0xffffffff;
  if ((this->super_QAnimationGroupPrivate).animations.d.size == 0) {
    uVar7 = 0;
  }
  else {
    uVar6 = 0;
    uVar5 = 0;
    do {
      uVar7 = (ulong)uVar5;
      iVar3 = QAbstractAnimation::totalDuration
                        ((QAbstractAnimation *)
                         (this->super_QAnimationGroupPrivate).animations.d.ptr[uVar6]);
      if ((iVar3 == -1) &&
         (((ulong)(this->actualDuration).d.size <= uVar6 ||
          (iVar3 = (this->actualDuration).d.ptr[uVar6], iVar3 == -1)))) goto LAB_003ae122;
      uVar5 = iVar3 + uVar5;
      uVar1 = (this->super_QAnimationGroupPrivate).super_QAbstractAnimationPrivate.currentTime;
      if (((int)uVar1 < (int)uVar5) ||
         ((uVar1 == uVar5 &&
          (pVar4 = QObjectCompatProperty<QAbstractAnimationPrivate,_QAbstractAnimation::Direction,_&QAbstractAnimationPrivate::_qt_property_direction_offset,_&QAbstractAnimationPrivate::setDirection,_&QAbstractAnimationPrivate::emitDirectionChanged,_nullptr>
                   ::value(&(this->super_QAnimationGroupPrivate).super_QAbstractAnimationPrivate.
                            direction), pVar4 == Backward)))) goto LAB_003ae122;
      uVar6 = uVar6 + 1;
      uVar2 = (this->super_QAnimationGroupPrivate).animations.d.size;
    } while (uVar6 < uVar2);
    uVar6 = uVar2 + 0xffffffff;
  }
LAB_003ae122:
  return (AnimationIndex)(uVar6 & 0xffffffff | uVar7 << 0x20);
}

Assistant:

QSequentialAnimationGroupPrivate::AnimationIndex QSequentialAnimationGroupPrivate::indexForCurrentTime() const
{
    Q_ASSERT(!animations.isEmpty());

    AnimationIndex ret;
    int duration = 0;

    for (int i = 0; i < animations.size(); ++i) {
        duration = animationActualTotalDuration(i);

        // 'animation' is the current animation if one of these reasons is true:
        // 1. it's duration is undefined
        // 2. it ends after msecs
        // 3. it is the last animation (this can happen in case there is at least 1 uncontrolled animation)
        // 4. it ends exactly in msecs and the direction is backwards
        if (duration == -1 || currentTime < (ret.timeOffset + duration)
            || (currentTime == (ret.timeOffset + duration) && direction == QAbstractAnimation::Backward)) {
            ret.index = i;
            return ret;
        }

        // 'animation' has a non-null defined duration and is not the one at time 'msecs'.
        ret.timeOffset += duration;
    }

    // this can only happen when one of those conditions is true:
    // 1. the duration of the group is undefined and we passed its actual duration
    // 2. there are only 0-duration animations in the group
    ret.timeOffset -= duration;
    ret.index = animations.size() - 1;
    return ret;
}